

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash_handler.c
# Opt level: O3

ion_err_t linear_hash_create_dictionary
                    (ion_dictionary_id_t id,ion_key_type_t key_type,ion_key_size_t key_size,
                    ion_value_size_t value_size,ion_dictionary_size_t dictionary_size,
                    ion_dictionary_compare_t compare,ion_dictionary_handler_t *handler,
                    ion_dictionary_t *dictionary)

{
  ion_err_t iVar1;
  linear_hash_table_t *linear_hash;
  
  linear_hash = (linear_hash_table_t *)malloc(0x78);
  dictionary->instance = (ion_dictionary_parent_t *)linear_hash;
  if (linear_hash == (linear_hash_table_t *)0x0) {
    iVar1 = '\x06';
  }
  else {
    (linear_hash->super).compare = compare;
    iVar1 = linear_hash_init(id,dictionary_size,key_type,key_size,value_size,4,0x55,4,linear_hash);
    if (handler != (ion_dictionary_handler_t *)0x0 && iVar1 == '\0') {
      dictionary->handler = handler;
      dictionary->instance->type = dictionary_type_linear_hash_t;
      iVar1 = '\0';
    }
  }
  return iVar1;
}

Assistant:

ion_err_t
linear_hash_create_dictionary(
	ion_dictionary_id_t			id,
	ion_key_type_t				key_type,
	ion_key_size_t				key_size,
	ion_value_size_t			value_size,
	ion_dictionary_size_t		dictionary_size,
	ion_dictionary_compare_t	compare,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dictionary
) {
	int initial_size, split_threshold, records_per_bucket;

	dictionary->instance = malloc(sizeof(linear_hash_table_t));

	if (NULL == dictionary->instance) {
		return err_out_of_memory;
	}

	dictionary->instance->compare	= compare;

	initial_size					= 4;
	split_threshold					= 85;
	records_per_bucket				= 4;

	/* TODO Should we handle the possible error code returned by this? If yes, what sorts of errors does it return? */
	ion_err_t result = linear_hash_init(id, dictionary_size, key_type, key_size, value_size, initial_size, split_threshold, records_per_bucket, (linear_hash_table_t *) dictionary->instance);

	if ((err_ok == result) && (NULL != handler)) {
		dictionary->handler			= handler;
		dictionary->instance->type	= dictionary_type_linear_hash_t;
	}

	return result;
}